

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O2

void avro::codec_traits<umu::_union_map_union_Union__1__>::decode
               (Decoder *d,_union_map_union_Union__1__ *v)

{
  ulong uVar1;
  Exception *this;
  allocator<char> local_49;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
  vv;
  
  uVar1 = (**(code **)(*(long *)d + 0xb0))();
  if (1 < uVar1) {
    this = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vv,"Union index too big",&local_49);
    Exception::Exception(this,(string *)&vv);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  if ((uVar1 & 1) != 0) {
    (**(code **)(*(long *)d + 0x18))(d);
    umu::_union_map_union_Union__1__::set_null(v);
    return;
  }
  vv._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vv._M_t._M_impl.super__Rb_tree_header._M_header;
  vv._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vv._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vv._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vv._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vv._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>_>
  ::decode(d,&vv);
  umu::_union_map_union_Union__1__::set_map(v,&vv);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
  ::~_Rb_tree(&vv._M_t);
  return;
}

Assistant:

static void decode(Decoder& d, umu::_union_map_union_Union__1__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            {
                std::map<std::string, umu::r3 > vv;
                avro::decode(d, vv);
                v.set_map(vv);
            }
            break;
        case 1:
            d.decodeNull();
            v.set_null();
            break;
        }
    }